

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O1

string * cmDocumentation::GeneralizeKeyword(string *__return_storage_ptr__,string *cname)

{
  _Base_ptr p_Var1;
  pointer pcVar2;
  undefined8 uVar3;
  bool bVar4;
  _Base_ptr p_Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  long *plVar7;
  long *plVar8;
  long lVar9;
  _Base_ptr p_Var10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  conversions;
  RegularExpression reg;
  string local_328;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_308;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_2d8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_2a8;
  _Base_ptr local_290;
  undefined8 local_288;
  undefined8 local_280;
  undefined8 local_278;
  char *local_270;
  undefined8 local_268;
  undefined1 local_260 [32];
  char *local_240 [2];
  char local_230 [16];
  char *local_220 [2];
  char local_210 [16];
  long *local_200 [2];
  long local_1f0 [2];
  char *local_1e0 [2];
  char local_1d0 [16];
  char *local_1c0 [2];
  char local_1b0 [16];
  char *local_1a0 [2];
  char local_190 [16];
  char *local_180 [2];
  char local_170 [16];
  char *local_160 [2];
  char local_150 [16];
  char *local_140 [2];
  char local_130 [16];
  char *local_120 [2];
  char local_110 [16];
  char *local_100 [2];
  char local_f0 [16];
  char *local_e0 [2];
  char local_d0 [16];
  char *local_c0 [2];
  char local_b0 [16];
  long *local_a0 [2];
  long local_90 [6];
  char *local_60;
  char *local_50;
  char *local_40;
  int local_38;
  
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2d8._M_impl.super__Rb_tree_header._M_header;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2d8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_260._0_8_ = local_260 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"C","");
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"CXX","");
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"CSharp","");
  plVar8 = local_1f0;
  local_200[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"CUDA","");
  local_1e0[0] = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"OBJC","");
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"OBJCXX","");
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"Fortran","");
  local_180[0] = local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"HIP","");
  local_160[0] = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"ISPC","");
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"Swift","");
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"ASM","");
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"ASM_NASM","");
  local_e0[0] = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"ASM_MARMASM","");
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"ASM_MASM","");
  plVar7 = local_90;
  local_a0[0] = plVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"ASM-ATT","");
  __l._M_len = 0xf;
  __l._M_array = (iterator)local_260;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2f0,__l,(allocator_type *)&local_2a8);
  lVar9 = -0x1e0;
  do {
    if (plVar7 != (long *)plVar7[-2]) {
      operator_delete((long *)plVar7[-2],*plVar7 + 1);
    }
    plVar7 = plVar7 + -4;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  local_260._0_8_ = local_260 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"DEBUG","");
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"RELEASE","");
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"RELWITHDEBINFO","");
  local_200[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"MINSIZEREL","");
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)local_260;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_308,__l_00,(allocator_type *)&local_2a8);
  lVar9 = -0x80;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    plVar8 = plVar8 + -4;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>>>
  ::
  _M_emplace_unique<char_const(&)[5],std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>>>
              *)&local_2d8,(char (*) [5])"LANG",&local_2f0);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>>>
  ::
  _M_emplace_unique<char_const(&)[7],std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>>>
              *)&local_2d8,(char (*) [7])0x8407a1,&local_308);
  if ((_Rb_tree_header *)local_2d8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_2d8._M_impl.super__Rb_tree_header) {
    p_Var5 = local_2d8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      p_Var1 = p_Var5[2]._M_parent;
      for (p_Var10 = *(_Base_ptr *)(p_Var5 + 2); p_Var10 != p_Var1; p_Var10 = p_Var10 + 1) {
        local_2a8.first._M_len = 6;
        local_2a8.first._M_str = "(^|_)(";
        local_2a8.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_288 = *(undefined8 *)p_Var10;
        local_290 = p_Var10->_M_parent;
        local_280 = 0;
        local_278 = 9;
        local_270 = ")(\\.|$|_)";
        local_268 = 0;
        views._M_len = 3;
        views._M_array = &local_2a8;
        cmCatViews(&local_328,views);
        local_50 = (char *)0x0;
        local_40 = (char *)0x0;
        local_38 = 0;
        memset((RegularExpression *)local_260,0,0x20a);
        cmsys::RegularExpression::compile((RegularExpression *)local_260,local_328._M_dataplus._M_p)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
        bVar4 = cmsys::RegularExpression::find
                          ((RegularExpression *)local_260,(cname->_M_dataplus)._M_p,
                           (RegularExpressionMatch *)local_260);
        if (bVar4) {
          std::__cxx11::string::replace
                    ((ulong)cname,local_260._16_8_ - (long)local_60,(char *)p_Var10->_M_parent,
                     *(ulong *)(p_Var5 + 1));
        }
        if (local_40 != (char *)0x0) {
          operator_delete__(local_40);
        }
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != &local_2d8._M_impl.super__Rb_tree_header);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (cname->_M_dataplus)._M_p;
  paVar6 = &cname->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar6) {
    uVar3 = *(undefined8 *)((long)&cname->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = cname->_M_string_length;
  (cname->_M_dataplus)._M_p = (pointer)paVar6;
  cname->_M_string_length = 0;
  (cname->field_2)._M_local_buf[0] = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_308);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2f0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_2d8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmDocumentation::GeneralizeKeyword(std::string cname)
{
  std::map<std::string, const std::vector<std::string>> conversions;
  std::vector<std::string> languages = {
    "C",      "CXX",      "CSharp",      "CUDA",     "OBJC",
    "OBJCXX", "Fortran",  "HIP",         "ISPC",     "Swift",
    "ASM",    "ASM_NASM", "ASM_MARMASM", "ASM_MASM", "ASM-ATT"
  };
  std::vector<std::string> configs = { "DEBUG", "RELEASE", "RELWITHDEBINFO",
                                       "MINSIZEREL" };
  conversions.emplace("LANG", std::move(languages));
  conversions.emplace("CONFIG", std::move(configs));
  for (auto const& it : conversions) {
    for (auto const& to_replace : it.second) {
      cmsys::RegularExpression reg(
        cmStrCat("(^|_)(", to_replace, ")(\\.|$|_)"));
      if (reg.find(cname)) {
        cname.replace(reg.start(2), to_replace.length(), it.first);
      }
    }
  }
  return cname;
}